

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_short,_bool,_bool,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_char>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short_const&,unsigned_short_const&,unsigned_char&,unsigned_char_const&,unsigned_char&,unsigned_char_const&,unsigned_char&,unsigned_short&,unsigned_short&,bool_const&,bool_const&,unsigned_char_const&,unsigned_char_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_short_const&,unsigned_char_const&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_short,_bool,_bool,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_char>
           *__return_storage_ptr__,v8 *this,unsigned_short *args,unsigned_short *args_1,
          uchar *args_2,uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,
          unsigned_short *args_7,unsigned_short *args_8,bool *args_9,bool *args_10,uchar *args_11,
          uchar *args_12,unsigned_short *args_13,uchar *args_14,unsigned_short *args_15,
          uchar *args_16,unsigned_short *args_17,unsigned_short *args_18,uchar *args_19)

{
  uchar *args_local_4;
  uchar *args_local_3;
  uchar *args_local_2;
  unsigned_short *args_local_1;
  unsigned_short *args_local;
  undefined8 local_4b0;
  type local_4a8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_498;
  type local_488;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_478;
  type local_468;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_458;
  type local_448;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_438;
  type local_428;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_418;
  type local_408;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_3f8;
  type local_3e8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_3d8;
  type local_3c8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_3b8;
  type local_3a8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_398;
  type local_388;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_378;
  type local_368;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_358;
  type local_348;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_338;
  type local_328;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_318;
  type local_308;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_2f8;
  type local_2e8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_2d8;
  type local_2c8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_2b8;
  type local_2a8;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_298;
  type local_288;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_278;
  type local_268;
  anon_union_16_16_d721ec3a_for_value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_1
  local_258;
  type local_248;
  unsigned_short *local_238;
  unsigned_short *local_230;
  unsigned_short *local_228;
  unsigned_short *local_220;
  unsigned_short *local_218;
  unsigned_short *local_210;
  unsigned_short *local_208;
  uchar *local_200;
  bool *local_1f8;
  bool *local_1f0;
  bool *local_1e8;
  unsigned_short *local_1e0;
  unsigned_short *local_1d8;
  uchar *local_1d0;
  uchar *local_1c8;
  uchar *local_1c0;
  uchar *local_1b8;
  unsigned_short *local_1b0;
  unsigned_short *local_1a8;
  v8 *local_1a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_short,_bool,_bool,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_char>
  *local_198;
  
  local_1c8 = args_4;
  local_1d0 = args_5;
  local_1d8 = (unsigned_short *)args_6;
  local_1e0 = args_7;
  local_1e8 = (bool *)args_8;
  local_1f0 = args_9;
  local_1f8 = args_10;
  local_200 = args_11;
  local_208 = (unsigned_short *)args_12;
  local_210 = args_13;
  local_218 = (unsigned_short *)args_14;
  local_220 = args_15;
  local_228 = (unsigned_short *)args_16;
  local_230 = args_17;
  local_238 = args_18;
  local_1c0 = args_3;
  local_1b8 = args_2;
  local_1b0 = args_1;
  local_1a8 = args;
  local_1a0 = this;
  local_198 = __return_storage_ptr__;
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_258.string,(unsigned_short *)this);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_278.string,local_1a8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_298.string,(uchar *)local_1b0);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_2b8.string,local_1b8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_2d8.string,local_1c0);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_2f8.string,local_1c8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_318.string,local_1d0);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_338.string,local_1d8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_358.string,local_1e0);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)7,_bool,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_378.string,local_1e8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)7,_bool,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_398.string,local_1f0);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_3b8.string,local_1f8);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_3d8.string,local_200);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_3f8.string,local_208);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_418.string,(uchar *)local_210);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_438.string,local_218);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_458.string,(uchar *)local_220);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_478.string,local_228);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_short,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &local_498.string,local_230);
  detail::
  make_arg<false,_fmt::v8::basic_format_context<fmt::v8::appender,_char>,_(fmt::v8::detail::type)2,_unsigned_char,_0>
            ((basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             &args_local,(uchar *)local_238);
  (__return_storage_ptr__->data_).args_[0].value_.field_0.long_long_value =
       local_258.long_long_value;
  (__return_storage_ptr__->data_).args_[0].value_.field_0.string.size = local_258.string.size;
  (__return_storage_ptr__->data_).args_[0].type_ = local_248;
  (__return_storage_ptr__->data_).args_[1].value_.field_0.long_long_value =
       local_278.long_long_value;
  (__return_storage_ptr__->data_).args_[1].value_.field_0.string.size = local_278.string.size;
  (__return_storage_ptr__->data_).args_[1].type_ = local_268;
  (__return_storage_ptr__->data_).args_[2].value_.field_0.long_long_value =
       local_298.long_long_value;
  (__return_storage_ptr__->data_).args_[2].value_.field_0.string.size = local_298.string.size;
  (__return_storage_ptr__->data_).args_[2].type_ = local_288;
  (__return_storage_ptr__->data_).args_[3].value_.field_0.long_long_value =
       local_2b8.long_long_value;
  (__return_storage_ptr__->data_).args_[3].value_.field_0.string.size = local_2b8.string.size;
  (__return_storage_ptr__->data_).args_[3].type_ = local_2a8;
  (__return_storage_ptr__->data_).args_[4].value_.field_0.long_long_value =
       local_2d8.long_long_value;
  (__return_storage_ptr__->data_).args_[4].value_.field_0.string.size = local_2d8.string.size;
  (__return_storage_ptr__->data_).args_[4].type_ = local_2c8;
  (__return_storage_ptr__->data_).args_[5].value_.field_0.long_long_value =
       local_2f8.long_long_value;
  (__return_storage_ptr__->data_).args_[5].value_.field_0.string.size = local_2f8.string.size;
  (__return_storage_ptr__->data_).args_[5].type_ = local_2e8;
  (__return_storage_ptr__->data_).args_[6].value_.field_0.long_long_value =
       local_318.long_long_value;
  (__return_storage_ptr__->data_).args_[6].value_.field_0.string.size = local_318.string.size;
  (__return_storage_ptr__->data_).args_[6].type_ = local_308;
  (__return_storage_ptr__->data_).args_[7].value_.field_0.long_long_value =
       local_338.long_long_value;
  (__return_storage_ptr__->data_).args_[7].value_.field_0.string.size = local_338.string.size;
  (__return_storage_ptr__->data_).args_[7].type_ = local_328;
  (__return_storage_ptr__->data_).args_[8].value_.field_0.long_long_value =
       local_358.long_long_value;
  (__return_storage_ptr__->data_).args_[8].value_.field_0.string.size = local_358.string.size;
  (__return_storage_ptr__->data_).args_[8].type_ = local_348;
  (__return_storage_ptr__->data_).args_[9].value_.field_0.long_long_value =
       local_378.long_long_value;
  (__return_storage_ptr__->data_).args_[9].value_.field_0.string.size = local_378.string.size;
  (__return_storage_ptr__->data_).args_[9].type_ = local_368;
  (__return_storage_ptr__->data_).args_[10].value_.field_0.long_long_value =
       local_398.long_long_value;
  (__return_storage_ptr__->data_).args_[10].value_.field_0.string.size = local_398.string.size;
  (__return_storage_ptr__->data_).args_[10].type_ = local_388;
  (__return_storage_ptr__->data_).args_[0xb].value_.field_0.long_long_value =
       local_3b8.long_long_value;
  (__return_storage_ptr__->data_).args_[0xb].value_.field_0.string.size = local_3b8.string.size;
  (__return_storage_ptr__->data_).args_[0xb].type_ = local_3a8;
  (__return_storage_ptr__->data_).args_[0xc].value_.field_0.long_long_value =
       local_3d8.long_long_value;
  (__return_storage_ptr__->data_).args_[0xc].value_.field_0.string.size = local_3d8.string.size;
  (__return_storage_ptr__->data_).args_[0xc].type_ = local_3c8;
  (__return_storage_ptr__->data_).args_[0xd].value_.field_0.long_long_value =
       local_3f8.long_long_value;
  (__return_storage_ptr__->data_).args_[0xd].value_.field_0.string.size = local_3f8.string.size;
  (__return_storage_ptr__->data_).args_[0xd].type_ = local_3e8;
  (__return_storage_ptr__->data_).args_[0xe].value_.field_0.long_long_value =
       local_418.long_long_value;
  (__return_storage_ptr__->data_).args_[0xe].value_.field_0.string.size = local_418.string.size;
  (__return_storage_ptr__->data_).args_[0xe].type_ = local_408;
  (__return_storage_ptr__->data_).args_[0xf].value_.field_0.long_long_value =
       local_438.long_long_value;
  (__return_storage_ptr__->data_).args_[0xf].value_.field_0.string.size = local_438.string.size;
  (__return_storage_ptr__->data_).args_[0xf].type_ = local_428;
  (__return_storage_ptr__->data_).args_[0x10].value_.field_0.long_long_value =
       local_458.long_long_value;
  (__return_storage_ptr__->data_).args_[0x10].value_.field_0.string.size = local_458.string.size;
  (__return_storage_ptr__->data_).args_[0x10].type_ = local_448;
  (__return_storage_ptr__->data_).args_[0x11].value_.field_0.long_long_value =
       local_478.long_long_value;
  (__return_storage_ptr__->data_).args_[0x11].value_.field_0.string.size = local_478.string.size;
  (__return_storage_ptr__->data_).args_[0x11].type_ = local_468;
  (__return_storage_ptr__->data_).args_[0x12].value_.field_0.long_long_value =
       local_498.long_long_value;
  (__return_storage_ptr__->data_).args_[0x12].value_.field_0.string.size = local_498.string.size;
  (__return_storage_ptr__->data_).args_[0x12].type_ = local_488;
  (__return_storage_ptr__->data_).args_[0x13].value_.field_0.string.data = (char *)args_local;
  (__return_storage_ptr__->data_).args_[0x13].value_.field_0.string.size = local_4b0;
  (__return_storage_ptr__->data_).args_[0x13].type_ = local_4a8;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}